

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_load(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  GCstr *pGVar3;
  GCstr *pGVar4;
  GCstr *pGVar5;
  GCstr *chunkname;
  GCstr **data;
  code *reader;
  GCstr *local_30;
  ulong local_28;
  
  if ((L->base + 1 < L->top) && (*(int *)((long)L->base + 0xc) != -1)) {
    pGVar3 = lj_lib_checkstr(L,2);
  }
  else {
    pGVar3 = (GCstr *)0x0;
  }
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    pGVar4 = lj_lib_checkstr(L,3);
  }
  else {
    pGVar4 = (GCstr *)0x0;
  }
  pTVar1 = L->base;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffffb || (pTVar1->field_2).it < 0xffff0000)
     ) {
    pGVar5 = lj_lib_checkstr(L,1);
    lua_settop(L,4);
    local_30 = pGVar5 + 1;
    if (pGVar3 == (GCstr *)0x0) {
      pGVar3 = pGVar5;
    }
    chunkname = pGVar3 + 1;
    pGVar3 = pGVar4 + 1;
    if (pGVar4 == (GCstr *)0x0) {
      pGVar3 = pGVar4;
    }
    local_28 = (ulong)pGVar5->len;
    data = &local_30;
    reader = reader_string;
  }
  else {
    if ((L->top <= pTVar1) || ((pTVar1->field_2).it != 0xfffffff7)) {
      lj_err_argt(L,1,6);
    }
    lua_settop(L,5);
    chunkname = (GCstr *)"=(load)";
    if (pGVar3 != (GCstr *)0x0) {
      chunkname = pGVar3 + 1;
    }
    pGVar3 = pGVar4 + 1;
    if (pGVar4 == (GCstr *)0x0) {
      pGVar3 = pGVar4;
    }
    reader = reader_func;
    data = (GCstr **)0x0;
  }
  iVar2 = lua_loadx(L,reader,data,(char *)chunkname,(char *)pGVar3);
  iVar2 = load_aux(L,iVar2,4);
  return iVar2;
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top && (tvisstr(L->base) || tvisnumber(L->base))) {
    GCstr *s = lj_lib_checkstr(L, 1);
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, strdata(s), s->len, strdata(name ? name : s),
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}